

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_StereoWidener.cpp
# Opt level: O2

int StereoWidener::InternalRegisterEffectDefinition(UnityAudioEffectDefinition *definition)

{
  UnityAudioParameterDefinition *pUVar1;
  
  pUVar1 = (UnityAudioParameterDefinition *)operator_new__(0xc0);
  definition->paramdefs = pUVar1;
  RegisterParameter(definition,"Amount","%",-10.0,10.0,1.0,100.0,1.0,0,
                    "Amount of stereo widening applied. The default of 100% corresponds to the original stereo width of the input signal."
                   );
  RegisterParameter(definition,"Pre-delay","ms",-0.0025,0.0025,0.0,1000.0,3.0,1,
                    "Pre-delay applied before the stereo widening.");
  RegisterParameter(definition,"Post-delay","ms",-0.0025,0.0025,0.0,1000.0,3.0,2,
                    "Post-delay applied after the stereo widening.");
  return 3;
}

Assistant:

int InternalRegisterEffectDefinition(UnityAudioEffectDefinition& definition)
    {
        int numparams = P_NUM;
        definition.paramdefs = new UnityAudioParameterDefinition[numparams];
        RegisterParameter(definition, "Amount", "%", -10.0f, 10.0f, 1.0f, 100.0f, 1.0f, P_AMOUNT, "Amount of stereo widening applied. The default of 100% corresponds to the original stereo width of the input signal.");
        RegisterParameter(definition, "Pre-delay", "ms", -0.0025f, 0.0025f, 0.0f, 1000.0f, 3.0f, P_PREDLY, "Pre-delay applied before the stereo widening.");
        RegisterParameter(definition, "Post-delay", "ms", -0.0025f, 0.0025f, 0.0f, 1000.0f, 3.0f, P_POSTDLY, "Post-delay applied after the stereo widening.");
        return numparams;
    }